

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.h
# Opt level: O0

void __thiscall Node::~Node(Node *this)

{
  Node *pNVar1;
  Node *this_local;
  
  pNVar1 = this->Tree[0];
  if (pNVar1 != (Node *)0x0) {
    ~Node(pNVar1);
    operator_delete(pNVar1,0x70);
  }
  pNVar1 = this->Tree[1];
  if (pNVar1 != (Node *)0x0) {
    ~Node(pNVar1);
    operator_delete(pNVar1,0x70);
  }
  pNVar1 = this->Tree[2];
  if (pNVar1 != (Node *)0x0) {
    ~Node(pNVar1);
    operator_delete(pNVar1,0x70);
  }
  pNVar1 = this->Tree[3];
  if (pNVar1 != (Node *)0x0) {
    ~Node(pNVar1);
    operator_delete(pNVar1,0x70);
  }
  pNVar1 = this->Tree[4];
  if (pNVar1 != (Node *)0x0) {
    ~Node(pNVar1);
    operator_delete(pNVar1,0x70);
  }
  pNVar1 = this->Block[0];
  if (pNVar1 != (Node *)0x0) {
    ~Node(pNVar1);
    operator_delete(pNVar1,0x70);
  }
  pNVar1 = this->Block[1];
  if (pNVar1 != (Node *)0x0) {
    ~Node(pNVar1);
    operator_delete(pNVar1,0x70);
  }
  pNVar1 = this->Block[2];
  if (pNVar1 != (Node *)0x0) {
    ~Node(pNVar1);
    operator_delete(pNVar1,0x70);
  }
  std::__cxx11::string::~string((string *)&this->TextValue);
  return;
}

Assistant:

~Node() { delete Tree[0]; delete Tree[1]; delete Tree[2];
		delete Tree[3]; delete Tree[4];
		delete Block[0]; delete Block[1]; delete Block[2]; }